

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void __thiscall
google::protobuf::ExtensionRangeOptions::SharedCtor(ExtensionRangeOptions *this,Arena *arena)

{
  (this->field_0)._impl_._extensions_.arena_ = arena;
  *(undefined4 *)((long)&this->field_0 + 8) = 0;
  (this->field_0)._impl_._extensions_.map_.flat = (KeyValue *)0x0;
  *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
  (this->field_0)._impl_.declaration_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ = (void *)0x0;
  *(int *)((long)&this->field_0 + 0x28) = 0;
  *(int *)((long)&this->field_0 + 0x2c) = 0;
  (this->field_0)._impl_.declaration_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       (void *)0x0;
  *(int *)((long)&this->field_0 + 0x40) = 0;
  *(int *)((long)&this->field_0 + 0x44) = 0;
  (this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_0)._impl_.verification_ = 1;
  (this->field_0)._impl_.features_ = (FeatureSet *)0x0;
  return;
}

Assistant:

constexpr ExtensionSet::ExtensionSet(Arena* arena)
    : arena_(arena), flat_capacity_(0), flat_size_(0), map_{nullptr} {}